

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_sound_envs.cxx
# Opt level: O3

void __thiscall xray_re::xr_sound_env_object::load(xr_sound_env_object *this,xr_reader *r)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint16_t version;
  short local_12;
  
  local_12 = (short)((ulong)in_RAX >> 0x30);
  sVar1 = xr_reader::r_raw_chunk(r,0x1001,&local_12,2);
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                  ,0x11,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
  }
  if (local_12 == 0x12) {
    xr_custom_object::load((xr_custom_object *)this,r);
    sVar1 = xr_reader::find_chunk(r,0x1003);
    if (sVar1 != 0) {
      xr_reader::r_sz(r,&this->m_inner);
      xr_reader::r_sz(r,&this->m_outer);
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                  ,0x15,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
  }
  __assert_fail("version == SOUNDENV_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_sound_envs.cxx"
                ,0x12,"virtual void xray_re::xr_sound_env_object::load(xr_reader &)");
}

Assistant:

void xr_sound_env_object::load(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(SOUNDENV_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOUNDENV_VERSION);
	xr_custom_object::load(r);
	if (!r.find_chunk(SOUNDENV_CHUNK_ENV_REFS))
		xr_not_expected();
	r.r_sz(m_inner);
	r.r_sz(m_outer);
	r.debug_find_chunk();
}